

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O1

jpc_mqenc_t * jpc_mqenc_create(int maxctxs,jas_stream_t *out)

{
  jpc_mqenc_t *mqenc;
  jpc_mqstate_t **ppjVar1;
  
  mqenc = (jpc_mqenc_t *)jas_malloc(0x50);
  if (mqenc != (jpc_mqenc_t *)0x0) {
    mqenc->out = out;
    mqenc->maxctxs = maxctxs;
    ppjVar1 = (jpc_mqstate_t **)jas_alloc2((long)maxctxs,8);
    mqenc->ctxs = ppjVar1;
    if (ppjVar1 != (jpc_mqstate_t **)0x0) {
      mqenc->curctx = ppjVar1;
      mqenc->areg = 0x8000;
      mqenc->outbuf = -1;
      mqenc->creg = 0;
      mqenc->ctreg = 0xc;
      mqenc->lastbyte = -1;
      mqenc->err = 0;
      jpc_mqenc_setctxs(mqenc,0,(jpc_mqctx_t *)0x0);
      return mqenc;
    }
    jas_free((void *)0x0);
    jas_free(mqenc);
  }
  return (jpc_mqenc_t *)0x0;
}

Assistant:

jpc_mqenc_t *jpc_mqenc_create(int maxctxs, jas_stream_t *out)
{
	jpc_mqenc_t *mqenc;

	/* Allocate memory for the MQ encoder. */
	if (!(mqenc = jas_malloc(sizeof(jpc_mqenc_t)))) {
		goto error;
	}
	mqenc->out = out;
	mqenc->maxctxs = maxctxs;

	/* Allocate memory for the per-context state information. */
	if (!(mqenc->ctxs = jas_alloc2(mqenc->maxctxs, sizeof(jpc_mqstate_t *)))) {
		goto error;
	}

	/* Set the current context to the first one. */
	mqenc->curctx = mqenc->ctxs;

	jpc_mqenc_init(mqenc);

	/* Initialize the per-context state information to something sane. */
	jpc_mqenc_setctxs(mqenc, 0, 0);

	return mqenc;

error:
	if (mqenc) {
		jpc_mqenc_destroy(mqenc);
	}
	return 0;
}